

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cpp
# Opt level: O2

void __thiscall MeterPrivate::drawLabels(MeterPrivate *this,QPainter *painter,DrawParams *params)

{
  uint uVar1;
  QFont *pQVar2;
  int iVar3;
  int i;
  int iVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  double local_d0;
  QFontMetricsF fm;
  QFont f;
  QString str;
  QFont f_3;
  
  if ((0.0 < this->scaleGridStep) && (this->drawGridValues == true)) {
    QPainter::save();
    QPainter::translate(painter,(double)this->radius,(double)this->radius);
    QPainter::setPen((QColor *)painter);
    uVar1 = this->startScaleAngle;
    dVar9 = this->maxValue;
    local_d0 = this->minValue;
    dVar8 = this->scaleGridStep;
    dVar12 = params->scaleDegree;
    pQVar2 = (QFont *)QPainter::font();
    QFont::QFont(&f,pQVar2);
    QFont::setPixelSize((int)&f);
    QPainter::setFont((QFont *)painter);
    QFontMetricsF::QFontMetricsF(&fm,&f);
    dVar9 = dVar9 - local_d0;
    dVar10 = dVar9 / dVar8;
    iVar3 = (int)dVar10;
    for (iVar4 = 0; iVar4 <= iVar3; iVar4 = iVar4 + 1) {
      dVar6 = (double)iVar4 * (dVar12 / dVar9) * dVar8 * -0.017453292519943295 +
              (double)uVar1 * -0.017453292519943295;
      dVar7 = sin(dVar6);
      dVar6 = cos(dVar6);
      QString::number(local_d0,(char)&str.d,0x66);
      auVar13 = QFontMetricsF::size((int)&fm,(QString *)0x100,(int)&str.d,(int *)0x0);
      dVar11 = params->margin * -3.0 + ((double)this->radius - params->gridLabelSize);
      QPainter::drawText(painter,(int)(dVar7 * dVar11 + auVar13._0_8_ * -0.5),
                         (int)(dVar11 * dVar6 + auVar13._8_8_ * 0.25),(QString *)&str.d);
      local_d0 = local_d0 + this->scaleGridStep;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&str.d);
    }
    dVar10 = dVar10 - (double)iVar3;
    uVar5 = -(ulong)(dVar10 < -dVar10);
    if (1e-06 < (double)(~uVar5 & (ulong)dVar10 | (ulong)-dVar10 & uVar5)) {
      dVar9 = (params->startScaleAngle + params->scaleDegree) * -0.017453292519943295;
      dVar8 = sin(dVar9);
      dVar9 = cos(dVar9);
      QString::number(this->maxValue,(char)&str,0x66);
      auVar13 = QFontMetricsF::size((int)&fm,(QString *)0x100,(int)&str,(int *)0x0);
      dVar12 = params->margin * -3.0 + ((double)this->radius - params->gridLabelSize);
      QPainter::drawText(painter,(int)(dVar8 * dVar12 + auVar13._0_8_ * -0.5),
                         (int)(dVar12 * dVar9 + auVar13._8_8_ * 0.25),&str);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&str.d);
    }
    QPainter::restore();
    QFontMetricsF::~QFontMetricsF(&fm);
    QFont::~QFont(&f);
  }
  if ((this->unitsLabel).d.size != 0) {
    QPainter::save();
    pQVar2 = (QFont *)QPainter::font();
    QFont::QFont((QFont *)&fm,pQVar2);
    QFont::setPixelSize((int)(QFont *)&fm);
    QPainter::setFont((QFont *)painter);
    QPainter::setPen((QColor *)painter);
    str.d.size = (qsizetype)(double)(this->radius * 2);
    str.d.d = (Data *)0x0;
    str.d.ptr = (char16_t *)(params->margin * 3.0 + params->gridLabelSize * 3.0);
    QTextOption::QTextOption((QTextOption *)&f,4);
    QPainter::drawText((QRectF *)painter,&str,(QTextOption *)&this->unitsLabel);
    QTextOption::~QTextOption((QTextOption *)&f);
    QPainter::restore();
    QFont::~QFont((QFont *)&fm);
  }
  if ((this->label).d.size != 0) {
    QPainter::save();
    pQVar2 = (QFont *)QPainter::font();
    QFont::QFont((QFont *)&fm,pQVar2);
    QFont::setPixelSize((int)(QFont *)&fm);
    QPainter::setFont((QFont *)painter);
    QPainter::setPen((QColor *)painter);
    str.d.size = (qsizetype)(double)(this->radius * 2);
    str.d.d = (Data *)0x0;
    str.d.ptr = (char16_t *)
                (((double)str.d.size - params->margin * 3.0) - params->gridLabelSize * 3.0);
    QTextOption::QTextOption((QTextOption *)&f,4);
    QPainter::drawText((QRectF *)painter,&str,(QTextOption *)&this->label);
    QTextOption::~QTextOption((QTextOption *)&f);
    QPainter::restore();
    QFont::~QFont((QFont *)&fm);
  }
  if (this->drawValue == true) {
    QPainter::save();
    pQVar2 = (QFont *)QPainter::font();
    QFont::QFont(&f_3,pQVar2);
    QFont::setPixelSize((int)&f_3);
    QFont::setWeight((Weight)&f_3);
    QPainter::setFont((QFont *)painter);
    QPainter::setPen((QColor *)painter);
    str.d.size = (qsizetype)(double)(this->radius * 2);
    str.d.ptr = (char16_t *)
                (((double)str.d.size - params->margin) -
                (params->gridLabelSize + params->gridLabelSize));
    str.d.d = (Data *)0x0;
    QString::number(this->value,(char)&f,0x66);
    QTextOption::QTextOption((QTextOption *)&fm,4);
    QPainter::drawText((QRectF *)painter,&str,(QTextOption *)&f);
    QTextOption::~QTextOption((QTextOption *)&fm);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&f);
    QPainter::restore();
    QFont::~QFont(&f_3);
  }
  return;
}

Assistant:

void
MeterPrivate::drawLabels( QPainter & painter, DrawParams & params )
{
	if( scaleGridStep > 0.0 && drawGridValues )
	{
		painter.save();
		painter.translate( radius, radius );
		painter.setPen( textColor );

		qreal startRad = - qDegreesToRadians( (qreal) startScaleAngle  );
		int stepsCount = ( ( maxValue - minValue ) / scaleGridStep );
		const qreal fullStepsCount = ( ( maxValue - minValue ) / scaleGridStep );
		qreal deltaRad = - qDegreesToRadians( params.scaleDegree /
			( maxValue - minValue ) * scaleGridStep );
		qreal sina, cosa;
		qreal val = minValue;

		QFont f = painter.font();
		f.setPixelSize( params.fontPixelSize );
		painter.setFont( f );
		QFontMetricsF fm( f );

		for ( int i = 0; i <= stepsCount; ++i )
		{
			sina = qSin( startRad + i * deltaRad );
			cosa = qCos( startRad + i * deltaRad );

			const QString str = QString::number( val, 'f', scalePrecision );

			const QSizeF s = fm.size( Qt::TextSingleLine, str );

			const qreal offset = ( radius - params.gridLabelSize - params.margin * 3 );

			const int x = ( offset * sina ) - ( s.width() / 2 );
			const int y = ( offset * cosa ) + ( s.height() / 4 );

			painter.drawText( x, y, str );

			val += scaleGridStep;
		}

		if( qAbs( fullStepsCount - stepsCount ) > 0.000001 )
		{
			const qreal rad = - qDegreesToRadians( params.startScaleAngle + params.scaleDegree );

			sina = qSin( rad );
			cosa = qCos( rad );

			const QString str = QString::number( maxValue, 'f', scalePrecision );

			const QSizeF s = fm.size( Qt::TextSingleLine, str );

			const qreal offset = ( radius - params.gridLabelSize - params.margin * 3 );

			const int x = ( offset * sina ) - ( s.width() / 2 );
			const int y = ( offset * cosa ) + ( s.height() / 4 );

			painter.drawText( x, y, str );
		}

		painter.restore();
	}

	if( !unitsLabel.isEmpty() )
	{
		painter.save();
		QFont f = painter.font();
		f.setPixelSize( params.fontPixelSize );
		painter.setFont( f );
		painter.setPen( textColor );
		painter.drawText( QRectF( 0, params.margin * 3 + params.gridLabelSize * 3,
			radius * 2, radius ), unitsLabel, QTextOption( Qt::AlignHCenter ) );
		painter.restore();
	}

	if( !label.isEmpty() )
	{
		painter.save();
		QFont f = painter.font();
		f.setPixelSize( params.fontPixelSize );
		painter.setFont( f );
		painter.setPen( textColor );
		painter.drawText( QRectF( 0, radius * 2 - params.margin * 3 - params.gridLabelSize * 3,
			radius * 2, radius ), label, QTextOption( Qt::AlignHCenter ) );
		painter.restore();
	}

	if( drawValue )
	{
		painter.save();
		QFont f = painter.font();
		f.setPixelSize( params.fontPixelSize * 2 );
		f.setBold( true );
		painter.setFont( f );
		painter.setPen( textColor );
		painter.drawText( QRectF( 0, radius * 2 - params.margin - params.gridLabelSize * 2,
			radius * 2, radius ), QString::number( value, 'f', valuePrecision ),
			QTextOption( Qt::AlignHCenter ) );
		painter.restore();
	}
}